

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O2

int __thiscall
RpcClient::IssueRequest
          (RpcClient *this,shared_ptr<RpcMessage> *request,shared_ptr<RpcMessage> *response)

{
  atomic<unsigned_long_long> *paVar1;
  NarpcStaging *this_00;
  __int_type _Var2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  unsigned_long_long ticket;
  string sStack_48;
  __shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  LOCK();
  paVar1 = &this->counter_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long_long>)._M_i + 1;
  UNLOCK();
  uVar5 = (ulong)((uint)_Var2 & 7);
  ticket = uVar5 + (uVar5 == 0);
  std::__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&this->responseMap_[0].
                     super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (ulong)(uint)((int)ticket << 4)),
             &response->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = &this->staging_;
  NarpcStaging::Clear(this_00);
  poVar4 = std::operator<<((ostream *)&std::cout,"RpcClient::IssueRequest ");
  (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_RpcMessage
    [4])(&sStack_48);
  poVar4 = std::operator<<(poVar4,&sStack_48);
  poVar4 = std::operator<<(poVar4," (size ");
  iVar3 = (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_RpcMessage[3])();
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::string::~string(&sStack_48);
  iVar3 = (*((request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_RpcMessage[3])();
  NarpcStaging::AddHeader(this_00,iVar3,ticket);
  iVar3 = this->socket_;
  std::__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&request->super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>);
  NarpcStaging::SendMessage(this_00,iVar3,(shared_ptr<RpcMessage> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return 0;
}

Assistant:

int RpcClient::IssueRequest(shared_ptr<RpcMessage> request,
                            shared_ptr<RpcMessage> response) {
  unsigned long long ticket = counter_++ % RpcClient::kMaxTicket;
  if (ticket == 0) {
    ticket++;
  }
  responseMap_[ticket] = response;
  // stream_.Clear();
  staging_.Clear();

  cout << "RpcClient::IssueRequest " << request->ToString() << " (size "
       << request->Size() << ")" << endl;

  // serialize header
  // stream_.PutInt(request->Size());
  // stream_.PutLong(ticket);
  staging_.AddHeader(request->Size(), ticket);

  // serialize rpc message
  // request->Write(stream_);

  // write message to network
  // stream_.Write(socket_);
  //
  staging_.SendMessage(socket_, request);

  return 0;
}